

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

int __thiscall
BER_CONTAINER::serialise(BER_CONTAINER *this,uint8_t *buf,size_t max_len,size_t known_length)

{
  uint uVar1;
  uint8_t *puVar2;
  int iVar3;
  
  uVar1 = 0xffffffe1;
  if (1 < max_len) {
    *buf = (char)this->_type;
    puVar2 = buf + 1;
    iVar3 = 1;
    if (0x7f < known_length) {
      if (known_length < 0x101) {
        *puVar2 = 0x81;
        puVar2 = buf + 2;
        iVar3 = 2;
      }
      else {
        *puVar2 = 0x82;
        buf[2] = (uint8_t)(known_length >> 8);
        puVar2 = buf + 3;
        iVar3 = 3;
      }
    }
    *puVar2 = (uint8_t)known_length;
    uVar1 = 0xffffffe1;
    if (known_length + (iVar3 + 1U) <= max_len) {
      uVar1 = iVar3 + 1U;
    }
  }
  return uVar1;
}

Assistant:

int BER_CONTAINER::serialise(uint8_t* buf, size_t max_len, size_t known_length){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);
    i += encode_ber_length_integer(buf+i, known_length, max_len - i);
    if(max_len < known_length + i) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    return i;
}